

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42objs.c
# Opt level: O0

FT_Error T42_GlyphSlot_Init(FT_GlyphSlot t42slot)

{
  FT_Error local_34;
  FT_GlyphSlot pFStack_30;
  FT_Error error;
  FT_GlyphSlot ttslot;
  T42_Face t42face;
  FT_Face face;
  T42_GlyphSlot slot;
  FT_GlyphSlot t42slot_local;
  
  ttslot = (FT_GlyphSlot)t42slot->face;
  local_34 = 0;
  if (*(FT_GlyphSlot_conflict *)&(((T42_Face)ttslot)->root).glyph == (FT_GlyphSlot_conflict)0x0) {
    t42slot[1].library = (FT_Library)((T42_Face)ttslot)->ttf_face->glyph;
  }
  else {
    t42face = (T42_Face)ttslot;
    face = (FT_Face)t42slot;
    slot = (T42_GlyphSlot)t42slot;
    local_34 = FT_New_GlyphSlot(((T42_Face)ttslot)->ttf_face,&stack0xffffffffffffffd0);
    *(FT_GlyphSlot *)&face[1].num_fixed_sizes = pFStack_30;
  }
  return local_34;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T42_GlyphSlot_Init( FT_GlyphSlot  t42slot )        /* T42_GlyphSlot */
  {
    T42_GlyphSlot  slot    = (T42_GlyphSlot)t42slot;
    FT_Face        face    = t42slot->face;
    T42_Face       t42face = (T42_Face)face;
    FT_GlyphSlot   ttslot;
    FT_Error       error   = FT_Err_Ok;


    if ( !face->glyph )
    {
      /* First glyph slot for this face */
      slot->ttslot = t42face->ttf_face->glyph;
    }
    else
    {
      error = FT_New_GlyphSlot( t42face->ttf_face, &ttslot );
      slot->ttslot = ttslot;
    }

    return error;
  }